

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall
QPDF::JSONReactor::JSONReactor
          (JSONReactor *this,QPDF *pdf,shared_ptr<InputSource> *is,bool must_be_complete)

{
  element_type *peVar1;
  allocator<char> local_99;
  string local_98;
  undefined1 local_68 [71];
  byte local_21;
  shared_ptr<InputSource> *psStack_20;
  bool must_be_complete_local;
  shared_ptr<InputSource> *is_local;
  QPDF *pdf_local;
  JSONReactor *this_local;
  
  local_21 = must_be_complete;
  psStack_20 = is;
  is_local = (shared_ptr<InputSource> *)pdf;
  pdf_local = (QPDF *)this;
  JSON::Reactor::Reactor(&this->super_Reactor);
  (this->super_Reactor)._vptr_Reactor = (_func_int **)&PTR__JSONReactor_00590948;
  this->pdf = (QPDF *)is_local;
  std::shared_ptr<InputSource>::shared_ptr(&this->is,is);
  this->must_be_complete = (bool)(local_21 & 1);
  peVar1 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      is);
  (*peVar1->_vptr_InputSource[3])();
  std::make_shared<std::__cxx11::string,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
  QPDFObject::JSON_Descr::JSON_Descr
            ((JSON_Descr *)(local_68 + 0x10),
             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_68,&local_98);
  std::
  make_shared<std::variant<std::__cxx11::string,QPDFObject::JSON_Descr,QPDFObject::ChildDescr,QPDFObject::ObjStreamDescr>,QPDFObject::JSON_Descr>
            ((JSON_Descr *)&this->descr);
  QPDFObject::JSON_Descr::~JSON_Descr((JSON_Descr *)(local_68 + 0x10));
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_68);
  this->errors = false;
  this->saw_qpdf = false;
  this->saw_qpdf_meta = false;
  this->saw_objects = false;
  this->saw_json_version = false;
  this->saw_pdf_version = false;
  this->saw_trailer = false;
  std::__cxx11::string::string((string *)&this->cur_object);
  this->saw_value = false;
  this->saw_stream = false;
  this->saw_dict = false;
  this->saw_data = false;
  this->saw_datafile = false;
  this->this_stream_needs_data = false;
  std::vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>::vector
            (&this->stack);
  QPDFObjectHandle::QPDFObjectHandle(&this->next_obj);
  this->next_state = st_top;
  return;
}

Assistant:

JSONReactor(QPDF& pdf, std::shared_ptr<InputSource> is, bool must_be_complete) :
        pdf(pdf),
        is(is),
        must_be_complete(must_be_complete),
        descr(
            std::make_shared<QPDFObject::Description>(
                QPDFObject::JSON_Descr(std::make_shared<std::string>(is->getName()), "")))
    {
    }